

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void wait_for_top_right_sb
               (AV1EncRowMultiThreadInfo *enc_row_mt,AV1EncRowMultiThreadSync *row_mt_sync,
               TileInfo *tile_info,BLOCK_SIZE sb_size,int sb_mi_size_log2,BLOCK_SIZE bsize,
               int mi_row,int mi_col)

{
  uint uVar1;
  byte in_CL;
  int *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  int sb_col_in_tile;
  int sb_row_in_tile;
  int top_right_block_in_sb;
  int blk_col_in_sb;
  int blk_row_in_sb;
  int bw_in_mi;
  int sb_size_in_mi;
  bool local_41;
  
  uVar1 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_CL];
  local_41 = (sb_col_in_tile & uVar1 - 1) == 0 &&
             (int)uVar1 <=
             (int)((top_right_block_in_sb & uVar1 - 1) +
                  (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                        [in_R9B]);
  if (local_41) {
    (**(code **)(in_RDI + 0x130))
              (in_RSI,sb_col_in_tile - *in_RDX >> ((byte)in_R8D & 0x1f),
               top_right_block_in_sb - in_RDX[2] >> ((byte)in_R8D & 0x1f),in_R8D,in_R8D,
               sb_col_in_tile);
  }
  return;
}

Assistant:

static inline void wait_for_top_right_sb(AV1EncRowMultiThreadInfo *enc_row_mt,
                                         AV1EncRowMultiThreadSync *row_mt_sync,
                                         TileInfo *tile_info,
                                         BLOCK_SIZE sb_size,
                                         int sb_mi_size_log2, BLOCK_SIZE bsize,
                                         int mi_row, int mi_col) {
  const int sb_size_in_mi = mi_size_wide[sb_size];
  const int bw_in_mi = mi_size_wide[bsize];
  const int blk_row_in_sb = mi_row & (sb_size_in_mi - 1);
  const int blk_col_in_sb = mi_col & (sb_size_in_mi - 1);
  const int top_right_block_in_sb =
      (blk_row_in_sb == 0) && (blk_col_in_sb + bw_in_mi >= sb_size_in_mi);

  // Don't wait if the block is the not the top-right block in the superblock.
  if (!top_right_block_in_sb) return;

  // Wait for the top-right superblock to finish encoding.
  const int sb_row_in_tile =
      (mi_row - tile_info->mi_row_start) >> sb_mi_size_log2;
  const int sb_col_in_tile =
      (mi_col - tile_info->mi_col_start) >> sb_mi_size_log2;

  enc_row_mt->sync_read_ptr(row_mt_sync, sb_row_in_tile, sb_col_in_tile);
}